

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setLeaveBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined8 uVar7;
  double *pdVar9;
  long lVar10;
  long lVar11;
  pointer pnVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  pointer pnVar16;
  int *piVar17;
  byte bVar18;
  cpp_dec_float<200U,_int,_void> cStack_a8;
  
  bVar18 = 0;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[n]) {
  case P_FIXED:
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,-*pdVar9,(type *)0x0);
    pnVar12 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0x1c;
    pcVar14 = &cStack_a8;
    pnVar16 = pnVar12 + i;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *(undefined4 *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pnVar12[i].m_backend.exp = cStack_a8.exp;
    pnVar12[i].m_backend.neg = cStack_a8.neg;
    pnVar12[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar12[i].m_backend.prec_elem = cStack_a8.prec_elem;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,*pdVar9,(type *)0x0);
    pnVar12 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar14 = &cStack_a8;
    pnVar16 = pnVar12 + i;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *(undefined4 *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pnVar12[i].m_backend.exp = cStack_a8.exp;
    pnVar12[i].m_backend.neg = cStack_a8.neg;
    pnVar12[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar12[i].m_backend.prec_elem = cStack_a8.prec_elem;
    break;
  default:
    puVar13 = (uint *)((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + n);
    iVar4 = *puVar13;
    lVar11 = 0x1b;
    pcVar14 = &cStack_a8;
    puVar15 = puVar13;
    for (lVar10 = lVar11; puVar15 = puVar15 + 1, lVar10 != 0; lVar10 = lVar10 + -1) {
      *(uint *)pcVar14 = *puVar15;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    iVar5 = puVar13[0x1c];
    puVar15 = (uint *)((this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar7 = *(undefined8 *)(puVar13 + 0x1e);
    bVar18 = *(byte *)(puVar13 + 0x1d);
    *puVar15 = iVar4;
    pcVar14 = &cStack_a8;
    puVar13 = puVar15;
    for (; puVar13 = puVar13 + 1, lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar13 = *(uint *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    puVar15[0x1c] = iVar5;
    *(byte *)(puVar15 + 0x1d) = (iVar4 != 0 || (int)uVar7 != 0) ^ bVar18;
    *(undefined8 *)(puVar15 + 0x1e) = uVar7;
    pnVar12 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_003e8a4f;
  case P_ON_LOWER:
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,-*pdVar9,(type *)0x0);
    pnVar12 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar14 = &cStack_a8;
    pnVar16 = pnVar12 + i;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *(undefined4 *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pnVar12[i].m_backend.exp = cStack_a8.exp;
    pnVar12[i].m_backend.neg = cStack_a8.neg;
    pnVar12[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar12[i].m_backend.prec_elem = cStack_a8.prec_elem;
    pnVar12 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + n;
    iVar4 = *(int *)&(pnVar12->m_backend).data;
    lVar11 = 0x1b;
    puVar13 = (uint *)((long)&(pnVar12->m_backend).data + 4);
    pcVar14 = &cStack_a8;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(uint *)pcVar14 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    iVar5 = (pnVar12->m_backend).exp;
    pnVar16 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + i;
    uVar6 = (pnVar12->m_backend).fpclass;
    uVar8 = (pnVar12->m_backend).prec_elem;
    bVar3 = (pnVar12->m_backend).neg;
    *(int *)&(pnVar16->m_backend).data = iVar4;
    pcVar14 = &cStack_a8;
    puVar13 = (uint *)((long)&(pnVar16->m_backend).data + 4);
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar13 = *(uint *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    }
    (pnVar16->m_backend).exp = iVar5;
    (pnVar16->m_backend).neg = (bool)((iVar4 != 0 || uVar6 != 0) ^ bVar3);
    (pnVar16->m_backend).fpclass = uVar6;
    (pnVar16->m_backend).prec_elem = uVar8;
    break;
  case P_ON_UPPER:
    puVar15 = (uint *)((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + n);
    iVar4 = *puVar15;
    lVar11 = 0x1b;
    pcVar14 = &cStack_a8;
    puVar13 = puVar15;
    for (lVar10 = lVar11; puVar13 = puVar13 + 1, lVar10 != 0; lVar10 = lVar10 + -1) {
      *(uint *)pcVar14 = *puVar13;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    iVar5 = puVar15[0x1c];
    puVar13 = (uint *)((this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar7 = *(undefined8 *)(puVar15 + 0x1e);
    bVar2 = *(byte *)(puVar15 + 0x1d);
    *puVar13 = iVar4;
    pcVar14 = &cStack_a8;
    puVar15 = puVar13;
    for (; puVar15 = puVar15 + 1, lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = *(uint *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    puVar13[0x1c] = iVar5;
    *(byte *)(puVar13 + 0x1d) = (iVar4 != 0 || (int)uVar7 != 0) ^ bVar2;
    *(undefined8 *)(puVar13 + 0x1e) = uVar7;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,*pdVar9,(type *)0x0);
    pnVar12 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar14 = &cStack_a8;
    pnVar16 = pnVar12 + i;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *(undefined4 *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pnVar12[i].m_backend.exp = cStack_a8.exp;
    pnVar12[i].m_backend.neg = cStack_a8.neg;
    pnVar12[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar12[i].m_backend.prec_elem = cStack_a8.prec_elem;
    break;
  case P_FREE:
    puVar13 = (uint *)((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + n);
    iVar4 = *puVar13;
    lVar11 = 0x1b;
    pcVar14 = &cStack_a8;
    puVar15 = puVar13;
    for (lVar10 = lVar11; puVar15 = puVar15 + 1, lVar10 != 0; lVar10 = lVar10 + -1) {
      *(uint *)pcVar14 = *puVar15;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    iVar5 = puVar13[0x1c];
    puVar15 = (uint *)((this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar7 = *(undefined8 *)(puVar13 + 0x1e);
    bVar18 = *(byte *)(puVar13 + 0x1d);
    *puVar15 = iVar4;
    pcVar14 = &cStack_a8;
    puVar13 = puVar15;
    for (; puVar13 = puVar13 + 1, lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar13 = *(uint *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    puVar15[0x1c] = iVar5;
    *(byte *)(puVar15 + 0x1d) = (iVar4 != 0 || (int)uVar7 != 0) ^ bVar18;
    *(undefined8 *)(puVar15 + 0x1e) = uVar7;
    pnVar12 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_003e8a4f:
    puVar13 = (uint *)(pnVar12 + n);
    iVar4 = *puVar13;
    lVar10 = 0x1b;
    pcVar14 = &cStack_a8;
    puVar15 = puVar13;
    for (lVar11 = lVar10; puVar15 = puVar15 + 1, lVar11 != 0; lVar11 = lVar11 + -1) {
      *(uint *)pcVar14 = *puVar15;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    iVar5 = puVar13[0x1c];
    piVar1 = (int *)((this->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + i);
    uVar7 = *(undefined8 *)(puVar13 + 0x1e);
    bVar18 = *(byte *)(puVar13 + 0x1d);
    *piVar1 = iVar4;
    pcVar14 = &cStack_a8;
    piVar17 = piVar1;
    for (; piVar17 = piVar17 + 1, lVar10 != 0; lVar10 = lVar10 + -1) {
      *piVar17 = *(int *)pcVar14;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + 4);
    }
    piVar1[0x1c] = iVar5;
    *(byte *)(piVar1 + 0x1d) = (iVar4 != 0 || (int)uVar7 != 0) ^ bVar18;
    *(undefined8 *)(piVar1 + 0x1e) = uVar7;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}